

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O1

void __thiscall
celero::Experiment::addProblemSpace
          (Experiment *this,shared_ptr<celero::TestFixture::ExperimentValue> *x,double scale)

{
  shared_ptr<celero::ExperimentResult> r;
  undefined1 local_49;
  shared_ptr<celero::TestFixture::ExperimentValue> local_48;
  value_type local_38;
  double local_28;
  Experiment *local_20;
  
  local_38.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ExperimentResult *)0x0;
  local_28 = scale;
  local_20 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<celero::ExperimentResult,std::allocator<celero::ExperimentResult>,celero::Experiment*>
            (&local_38.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ExperimentResult **)&local_38,
             (allocator<celero::ExperimentResult> *)&local_49,&local_20);
  local_48.super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (x->super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  local_48.super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (x->super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_48.super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_48.
            super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_48.
            super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ExperimentResult::setProblemSpaceValue
            (local_38.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&local_48,local_28);
  if (local_48.super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  ::push_back((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
               *)(this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
                 .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>,&local_38);
  if (local_38.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Experiment::addProblemSpace(std::shared_ptr<celero::TestFixture::ExperimentValue> x, double scale)
{
	auto r = std::make_shared<celero::ExperimentResult>(this);
	r->setProblemSpaceValue(x, scale);
	this->pimpl->results.push_back(r);
}